

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSemaphore.cpp
# Opt level: O0

void __thiscall de::Semaphore::Semaphore(Semaphore *this,int initialValue,deUint32 flags)

{
  deSemaphore dVar1;
  bad_alloc *this_00;
  deSemaphoreAttributes local_1c;
  deUint32 local_18;
  deSemaphoreAttributes attribs;
  deUint32 flags_local;
  int initialValue_local;
  Semaphore *this_local;
  
  local_18 = flags;
  attribs.flags = initialValue;
  ::deMemset(&local_1c,0,4);
  local_1c.flags = local_18;
  dVar1 = deSemaphore_create(attribs.flags,&local_1c);
  this->m_semaphore = dVar1;
  if (this->m_semaphore == 0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

Semaphore::Semaphore (int initialValue, deUint32 flags)
{
	deSemaphoreAttributes attribs;
	deMemset(&attribs, 0, sizeof(attribs));
	attribs.flags = flags;

	m_semaphore = deSemaphore_create(initialValue, &attribs);
	if (!m_semaphore)
		throw std::bad_alloc();
}